

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apdu.c
# Opt level: O0

bool_t apduCmdIsValid(apdu_cmd_t *cmd)

{
  bool_t bVar1;
  void *in_RDI;
  undefined1 local_9;
  
  bVar1 = memIsValid(in_RDI,0x18);
  local_9 = false;
  if ((bVar1 != 0) && (local_9 = false, *(ulong *)((long)in_RDI + 0x10) < 0x10000)) {
    bVar1 = memIsValid((void *)((long)in_RDI + 0x18),*(size_t *)((long)in_RDI + 0x10));
    local_9 = false;
    if (bVar1 != 0) {
      local_9 = *(ulong *)((long)in_RDI + 8) < 0x10001;
    }
  }
  return (bool_t)local_9;
}

Assistant:

bool_t apduCmdIsValid(const apdu_cmd_t* cmd)
{
	return memIsValid(cmd, sizeof(apdu_cmd_t)) &&
		cmd->cdf_len < 65536 &&
		memIsValid(cmd->cdf, cmd->cdf_len) &&
		cmd->rdf_len <= 65536;
}